

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O1

void __thiscall QBlendStyleAnimation::updateCurrentTime(QBlendStyleAnimation *this,int time)

{
  uint uVar1;
  uint uVar2;
  undefined1 *puVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Format FVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  double dVar16;
  float fVar17;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QImage local_70 [16];
  undefined1 *local_60;
  code *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleAnimation::updateCurrentTime((QStyleAnimation *)this,time);
  iVar5 = (**(code **)(*(long *)this + 0x60))(this);
  if (iVar5 < 1) {
    if (0 < time) goto LAB_003a8b55;
  }
  else {
    if (*(int *)(this + 0x24) == 1) {
      iVar5 = (**(code **)(*(long *)this + 0x60))(this);
      iVar5 = time % iVar5;
      time = iVar5 * 2;
      iVar6 = (**(code **)(*(long *)this + 0x60))(this);
      if (iVar6 < time) {
        iVar6 = (**(code **)(*(long *)this + 0x60))(this);
        time = (iVar6 - iVar5) * 2;
      }
    }
    iVar5 = (**(code **)(*(long *)this + 0x60))(this);
    fVar17 = (float)time / (float)iVar5;
    if ((*(int *)(this + 0x24) != 0) ||
       (iVar5 = (**(code **)(*(long *)this + 0x60))(this), time <= iVar5)) goto LAB_003a8b6a;
LAB_003a8b55:
    QAbstractAnimation::stop();
  }
  fVar17 = 1.0;
LAB_003a8b6a:
  cVar4 = QImage::isNull();
  if ((cVar4 == '\0') && (cVar4 = QImage::isNull(), cVar4 == '\0')) {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_88);
    uVar7 = QImage::width();
    iVar5 = QImage::height();
    lVar9 = QImage::bytesPerLine();
    iVar6 = QImage::depth();
    if (iVar6 == 0x20) {
      FVar8 = QImage::format();
      QImage::QImage(local_70,uVar7,iVar5,FVar8);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (code *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
      puVar3 = local_60;
      local_48 = local_78;
      local_58 = QFileSystemModel::setResolveSymlinks;
      local_60 = (undefined1 *)0x0;
      local_78 = puVar3;
      QImage::~QImage((QImage *)&local_58);
      QImage::~QImage(local_70);
      dVar16 = (double)QImage::devicePixelRatio();
      QImage::setDevicePixelRatio(dVar16);
      lVar10 = QImage::bits();
      lVar11 = QImage::bits();
      lVar12 = QImage::bits();
      if (0 < iVar5) {
        iVar6 = (int)((float)((uint)(fVar17 * 256.0) & 0x80000000 | (uint)DAT_006759e0) +
                     fVar17 * 256.0);
        iVar13 = 0x100 - iVar6;
        iVar14 = 0;
        do {
          if (0 < (int)uVar7) {
            uVar15 = 0;
            do {
              uVar1 = *(uint *)(lVar11 + uVar15 * 4);
              uVar2 = *(uint *)(lVar12 + uVar15 * 4);
              *(uint *)(lVar10 + uVar15 * 4) =
                   (uVar2 & 0xff) * iVar6 + (uVar1 & 0xff) * iVar13 >> 8 & 0xff |
                   (uVar2 >> 8 & 0xff) * iVar6 + (uVar1 >> 8 & 0xff) * iVar13 & 0xff00 |
                   ((uVar2 >> 0x18) * iVar6 + (uVar1 >> 0x18) * iVar13 & 0xff00) << 0x10 |
                   ((uVar2 >> 0x10 & 0xff) * iVar6 + (uVar1 >> 0x10 & 0xff) * iVar13 & 0xff00) << 8;
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
          }
          lVar10 = lVar10 + lVar9;
          lVar11 = lVar11 + lVar9;
          lVar12 = lVar12 + lVar9;
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar5);
      }
    }
  }
  else {
    QImage::QImage((QImage *)&local_88);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
  puVar3 = local_78;
  local_58 = QFileSystemModel::setResolveSymlinks;
  local_78 = (undefined1 *)0x0;
  local_48 = *(undefined1 **)(this + 0x68);
  *(undefined1 **)(this + 0x68) = puVar3;
  QImage::~QImage((QImage *)&local_58);
  QImage::~QImage((QImage *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBlendStyleAnimation::updateCurrentTime(int time)
{
    QStyleAnimation::updateCurrentTime(time);

    float alpha = 1.0;
    if (duration() > 0) {
        if (_type == Pulse) {
            time = time % duration() * 2;
            if (time > duration())
                time = duration() * 2 - time;
        }

        alpha = time / static_cast<float>(duration());

        if (_type == Transition && time > duration()) {
            alpha = 1.0;
            stop();
        }
    } else if (time > 0) {
        stop();
    }

    _current = blendedImage(_start, _end, alpha);
}